

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ReduceLayerParams::_InternalParse
          (ReduceLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *p;
  char cVar6;
  uint uVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  float *local_30;
  
  local_30 = (float *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_30;
      uVar7 = (uint)bVar1;
      p = (float *)((long)local_30 + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar8 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar7);
          p = (float *)pVar8.first;
          uVar7 = pVar8.second;
        }
        else {
          p = (float *)((long)local_30 + 2);
        }
      }
      uVar3 = uVar7 >> 3;
      cVar6 = (char)uVar7;
      local_30 = p;
      if (uVar3 == 3) {
        if (cVar6 != '\x18') goto LAB_00277b06;
        uVar5 = (ulong)(char)*(byte *)p;
        local_30 = (float *)((long)p + 1);
        if ((long)uVar5 < 0) {
          uVar7 = ((uint)*(byte *)local_30 * 0x80 + (uint)*(byte *)p) - 0x80;
          if (-1 < (char)*(byte *)local_30) {
            uVar5 = (ulong)uVar7;
            local_30 = (float *)((long)p + 2);
            goto LAB_00277afb;
          }
          local_30 = p;
          pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
          iVar4 = (int)pVar9.second;
          local_30 = (float *)pVar9.first;
          if (local_30 == (float *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_00277afb:
          iVar4 = (int)uVar5;
        }
        this->axis_ = iVar4;
      }
      else if (uVar3 == 2) {
        if (cVar6 != '\x15') goto LAB_00277b06;
        this->epsilon_ = *p;
        local_30 = p + 1;
      }
      else if ((uVar3 == 1) && (cVar6 == '\b')) {
        uVar5 = (ulong)(char)*(byte *)p;
        local_30 = (float *)((long)p + 1);
        if ((long)uVar5 < 0) {
          uVar7 = ((uint)*(byte *)local_30 * 0x80 + (uint)*(byte *)p) - 0x80;
          if (-1 < (char)*(byte *)local_30) {
            uVar5 = (ulong)uVar7;
            local_30 = (float *)((long)p + 2);
            goto LAB_00277aa2;
          }
          local_30 = p;
          pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
          iVar4 = (int)pVar9.second;
          local_30 = (float *)pVar9.first;
          if (local_30 == (float *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_00277aa2:
          iVar4 = (int)uVar5;
        }
        this->mode_ = iVar4;
      }
      else {
LAB_00277b06:
        if ((uVar7 == 0) || ((uVar7 & 7) == 4)) {
          if (p == (float *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
          return (char *)p;
        }
        uVar5 = this_00->ptr_;
        if ((uVar5 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar5 & 0xfffffffffffffffc) + 8);
        }
        local_30 = (float *)google::protobuf::internal::UnknownFieldParse
                                      (uVar7,unknown,(char *)local_30,ctx);
        if (local_30 == (float *)0x0) {
          return (char *)0x0;
        }
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* ReduceLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.ReduceLayerParams.ReduceOperation mode = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_mode(static_cast<::CoreML::Specification::ReduceLayerParams_ReduceOperation>(val));
        } else
          goto handle_unusual;
        continue;
      // float epsilon = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          epsilon_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ReduceLayerParams.ReduceAxis axis = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_axis(static_cast<::CoreML::Specification::ReduceLayerParams_ReduceAxis>(val));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}